

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall
QCss::Parser::parse(Parser *this,StyleSheet *styleSheet,CaseSensitivity nameCaseSensitivity)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  Symbol *pSVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QLatin1StringView str_02;
  QLatin1StringView str_03;
  StyleRule rule;
  StyleRule local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str.m_data = "charset";
  str.m_size = 7;
  bVar3 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str);
  if (bVar3) {
    lVar2 = (this->symbols).d.size;
    lVar4 = (long)this->index;
    for (pSVar5 = (this->symbols).d.ptr + lVar4;
        (((lVar4 < lVar2 && (pSVar5->token == S)) || ((lVar4 < lVar2 && (pSVar5->token == CDO)))) ||
        ((lVar4 < lVar2 && (pSVar5->token == CDC)))); pSVar5 = pSVar5 + 1) {
      lVar4 = lVar4 + 1;
      this->index = (int)lVar4;
    }
    iVar1 = this->index;
    if ((iVar1 < lVar2) && (this->index = iVar1 + 1, (this->symbols).d.ptr[iVar1].token == STRING))
    {
      iVar1 = this->index;
      if ((iVar1 < lVar2) &&
         (this->index = iVar1 + 1, (this->symbols).d.ptr[iVar1].token == SEMICOLON))
      goto LAB_005eead4;
    }
    this->errorIndex = this->index;
  }
  else {
LAB_005eead4:
    lVar2 = (this->symbols).d.size;
    lVar4 = (long)this->index;
    for (pSVar5 = (this->symbols).d.ptr + lVar4;
        (((lVar4 < lVar2 && (pSVar5->token == S)) || ((lVar4 < lVar2 && (pSVar5->token == CDO)))) ||
        ((lVar4 < lVar2 && (pSVar5->token == CDC)))); pSVar5 = pSVar5 + 1) {
      lVar4 = lVar4 + 1;
      this->index = (int)lVar4;
    }
    do {
      str_00.m_data = "import";
      str_00.m_size = 6;
      bVar3 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str_00);
      if (!bVar3) {
        goto LAB_005eec5d;
      }
      local_78.declarations.d.ptr = (Declaration *)0x0;
      local_78.declarations.d.size = 0;
      local_78.selectors.d.size = 0;
      local_78.declarations.d.d = (Data *)0x0;
      local_78.selectors.d.d = (Data *)0x0;
      local_78.selectors.d.ptr = (Selector *)0x0;
      bVar3 = parseImport(this,(ImportRule *)&local_78);
      if (bVar3) {
        QtPrivate::QMovableArrayOps<QCss::ImportRule>::emplace<QCss::ImportRule_const&>
                  ((QMovableArrayOps<QCss::ImportRule> *)&styleSheet->importRules,
                   (styleSheet->importRules).d.size,(ImportRule *)&local_78);
        QList<QCss::ImportRule>::end(&styleSheet->importRules);
        lVar2 = (this->symbols).d.size;
        lVar4 = (long)this->index;
        for (pSVar5 = (this->symbols).d.ptr + lVar4;
            (((lVar4 < lVar2 && (pSVar5->token == S)) || ((lVar4 < lVar2 && (pSVar5->token == CDO)))
             ) || ((lVar4 < lVar2 && (pSVar5->token == CDC)))); pSVar5 = pSVar5 + 1) {
          lVar4 = lVar4 + 1;
          this->index = (int)lVar4;
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer
                ((QArrayDataPointer<QString> *)&local_78.declarations);
      if (&(local_78.selectors.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_78.selectors.d.d)->super_QArrayData,2,0x10);
        }
      }
    } while (bVar3);
  }
LAB_005eec09:
  bVar6 = false;
LAB_005eec0c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
LAB_005eec5d:
  str_01.m_data = "media";
  str_01.m_size = 5;
  bVar3 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str_01);
  if (bVar3) {
    local_78.declarations.d.ptr = (Declaration *)0x0;
    local_78.declarations.d.size = 0;
    local_78.selectors.d.size = 0;
    local_78.declarations.d.d = (Data *)0x0;
    local_78.selectors.d.d = (Data *)0x0;
    local_78.selectors.d.ptr = (Selector *)0x0;
    bVar3 = parseMedia(this,(MediaRule *)&local_78);
    if (!bVar3) {
      QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                ((QArrayDataPointer<QCss::StyleRule> *)&local_78.declarations);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
      goto LAB_005eec09;
    }
    QtPrivate::QMovableArrayOps<QCss::MediaRule>::emplace<QCss::MediaRule_const&>
              ((QMovableArrayOps<QCss::MediaRule> *)&styleSheet->mediaRules,
               (styleSheet->mediaRules).d.size,(MediaRule *)&local_78);
    QList<QCss::MediaRule>::end(&styleSheet->mediaRules);
    QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
              ((QArrayDataPointer<QCss::StyleRule> *)&local_78.declarations);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
  }
  else {
    str_02.m_data = "page";
    str_02.m_size = 4;
    bVar3 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str_02);
    if (bVar3) {
      local_78.declarations.d.ptr = (Declaration *)0x0;
      local_78.declarations.d.size = 0;
      local_78.selectors.d.size = 0;
      local_78.declarations.d.d = (Data *)0x0;
      local_78.selectors.d.d = (Data *)0x0;
      local_78.selectors.d.ptr = (Selector *)0x0;
      bVar3 = parsePage(this,(PageRule *)&local_78);
      if (bVar3) {
        QtPrivate::QMovableArrayOps<QCss::PageRule>::emplace<QCss::PageRule_const&>
                  ((QMovableArrayOps<QCss::PageRule> *)&styleSheet->pageRules,
                   (styleSheet->pageRules).d.size,(PageRule *)&local_78);
        QList<QCss::PageRule>::end(&styleSheet->pageRules);
      }
      QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
    }
    else {
      str_03.m_data = "keyframes";
      str_03.m_size = 9;
      bVar3 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str_03);
      if (!bVar3) {
        bVar3 = testSimpleSelector(this);
        if (bVar3) {
          local_78.selectors.d.d = (Data *)0x0;
          local_78.selectors.d.ptr = (Selector *)0x0;
          local_78.selectors.d.size = 0;
          local_78.declarations.d.d = (Data *)0x0;
          local_78.declarations.d.ptr = (Declaration *)0x0;
          local_78.declarations.d.size = 0;
          local_78.order = 0;
          local_78._52_4_ = 0xaaaaaaaa;
          bVar3 = parseRuleset(this,&local_78);
          if (!bVar3) {
            QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
            QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                      ((QArrayDataPointer<QCss::Selector> *)&local_78);
            goto LAB_005eec09;
          }
          QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
                    ((QMovableArrayOps<QCss::StyleRule> *)styleSheet,(styleSheet->styleRules).d.size
                     ,&local_78);
          QList<QCss::StyleRule>::end(&styleSheet->styleRules);
          QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
          QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                    ((QArrayDataPointer<QCss::Selector> *)&local_78);
        }
        else {
          iVar1 = this->index;
          lVar2 = (this->symbols).d.size;
          if ((iVar1 < lVar2) && ((this->symbols).d.ptr[iVar1].token == ATKEYWORD_SYM)) {
            this->index = iVar1 + 1;
            bVar6 = false;
            bVar3 = until(this,RBRACE,NONE);
            if (bVar3) goto LAB_005eede7;
            goto LAB_005eec0c;
          }
          if (this->index < lVar2) goto LAB_005eec09;
        }
        goto LAB_005eede7;
      }
      local_78.declarations.d.ptr = (Declaration *)0x0;
      local_78.declarations.d.size = 0;
      local_78.selectors.d.size = 0;
      local_78.declarations.d.d = (Data *)0x0;
      local_78.selectors.d.d = (Data *)0x0;
      local_78.selectors.d.ptr = (Selector *)0x0;
      bVar3 = parseAnimation(this,(AnimationRule *)&local_78);
      if (bVar3) {
        QtPrivate::QMovableArrayOps<QCss::AnimationRule>::emplace<QCss::AnimationRule_const&>
                  ((QMovableArrayOps<QCss::AnimationRule> *)&styleSheet->animationRules,
                   (styleSheet->animationRules).d.size,(AnimationRule *)&local_78);
        QList<QCss::AnimationRule>::end(&styleSheet->animationRules);
      }
      QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet>::~QArrayDataPointer
                ((QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet> *)&local_78.declarations)
      ;
    }
    if (&(local_78.selectors.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_78.selectors.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar3 == false) goto LAB_005eec09;
  }
LAB_005eede7:
  lVar2 = (this->symbols).d.size;
  lVar4 = (long)this->index;
  for (pSVar5 = (this->symbols).d.ptr + lVar4;
      (((lVar4 < lVar2 && (pSVar5->token == S)) || ((lVar4 < lVar2 && (pSVar5->token == CDO)))) ||
      ((lVar4 < lVar2 && (pSVar5->token == CDC)))); pSVar5 = pSVar5 + 1) {
    lVar4 = lVar4 + 1;
    this->index = (int)lVar4;
  }
  if (lVar2 <= this->index) goto LAB_005eef13;
  goto LAB_005eec5d;
LAB_005eef13:
  StyleSheet::buildIndexes(styleSheet,nameCaseSensitivity);
  bVar6 = true;
  goto LAB_005eec0c;
}

Assistant:

bool Parser::parse(StyleSheet *styleSheet, Qt::CaseSensitivity nameCaseSensitivity)
{
    if (testTokenAndEndsWith(ATKEYWORD_SYM, "charset"_L1)) {
        while (test(S) || test(CDO) || test(CDC)) {}
        if (!next(STRING)) return false;
        if (!next(SEMICOLON)) return false;
    }

    while (test(S) || test(CDO) || test(CDC)) {}

    while (testImport()) {
        ImportRule rule;
        if (!parseImport(&rule)) return false;
        styleSheet->importRules.append(rule);
        while (test(S) || test(CDO) || test(CDC)) {}
    }

    do {
        if (testMedia()) {
            MediaRule rule;
            if (!parseMedia(&rule)) return false;
            styleSheet->mediaRules.append(rule);
        } else if (testPage()) {
            PageRule rule;
            if (!parsePage(&rule)) return false;
            styleSheet->pageRules.append(rule);
        } else if (testAnimation()) {
            AnimationRule rule;
            if (!parseAnimation(&rule)) return false;
            styleSheet->animationRules.append(rule);
        } else if (testRuleset()) {
            StyleRule rule;
            if (!parseRuleset(&rule)) return false;
            styleSheet->styleRules.append(rule);
        } else if (test(ATKEYWORD_SYM)) {
            if (!until(RBRACE)) return false;
        } else if (hasNext()) {
            return false;
        }
        while (test(S) || test(CDO) || test(CDC)) {}
    } while (hasNext());
    styleSheet->buildIndexes(nameCaseSensitivity);
    return true;
}